

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::InternalSwap
          (RepeatedPtrField<google::protobuf::FileDescriptorProto> *this,
          RepeatedPtrField<google::protobuf::FileDescriptorProto> *other)

{
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *other_local;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *this_local;
  
  internal::RepeatedPtrFieldBase::InternalSwap
            (&this->super_RepeatedPtrFieldBase,&other->super_RepeatedPtrFieldBase);
  return;
}

Assistant:

void InternalSwap(RepeatedPtrField* other) {
    internal::RepeatedPtrFieldBase::InternalSwap(other);
  }